

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::write_double<long_double>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
           *this,longdouble value,format_specs *spec)

{
  alignment aVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined3 uVar5;
  basic_buffer<char> *pbVar4;
  unkbyte10 Var6;
  undefined2 uVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  char cVar11;
  size_t size;
  longdouble lVar12;
  float_spec_handler<char> handler;
  align_spec as;
  format_specs normalized_spec;
  write_inf_or_nan_t write_inf_or_nan;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  float_spec_handler<char> local_2c2;
  longdouble local_2c0;
  align_spec local_2b0;
  size_t local_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [20];
  char cStack_274;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_270;
  undefined1 local_268 [13];
  undefined3 uStack_25b;
  undefined5 uStack_258;
  char local_250;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  local_2c0 = value;
  local_298._0_10_ = value;
  Var6 = local_298._0_10_;
  local_298._8_2_ = (undefined2)((unkuint10)value >> 0x40);
  uVar7 = local_298._8_2_;
  local_2c2.type = spec->type_;
  local_2c2.upper = false;
  local_298._0_10_ = Var6;
  internal::handle_float_type_spec<char,fmt::v5::float_spec_handler<char>&>
            (local_2c2.type,&local_2c2);
  if ((short)uVar7 < 0) {
    lVar12 = -local_2c0;
    cVar11 = '-';
  }
  else {
    lVar12 = local_2c0;
    if ((spec->flags_ & 1) == 0) {
      cVar11 = '\0';
    }
    else {
      cVar11 = '+';
      if ((spec->flags_ & 2) == 0) {
        cVar11 = ' ';
      }
    }
  }
  local_268._0_4_ = (spec->super_align_spec).width_;
  local_268._4_4_ = (spec->super_align_spec).fill_;
  local_268._8_5_ = (undefined5)*(undefined8 *)&(spec->super_align_spec).align_;
  uVar3 = *(undefined8 *)((long)&spec->flags_ + 1);
  uStack_25b = (undefined3)uVar3;
  uStack_258 = (undefined5)((ulong)uVar3 >> 0x18);
  local_270 = this;
  local_250 = cVar11;
  if (NAN(lVar12)) {
    pcVar8 = "NAN";
    local_248.super_basic_buffer<char>.ptr_ = "nan";
LAB_0019869a:
    if (local_2c2.upper != false) {
      local_248.super_basic_buffer<char>.ptr_ = pcVar8;
    }
    local_248.super_basic_buffer<char>._vptr_basic_buffer =
         (_func_int **)CONCAT71(local_248.super_basic_buffer<char>._vptr_basic_buffer._1_7_,cVar11);
    basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
    ::
    write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::inf_or_nan_writer>
              ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                *)this,4 - (ulong)(cVar11 == '\0'),(align_spec *)local_268,
               (inf_or_nan_writer *)&local_248);
    return;
  }
  if ((longdouble)INFINITY <= lVar12) {
    pcVar8 = "INF";
    local_248.super_basic_buffer<char>.ptr_ = "inf";
    goto LAB_0019869a;
  }
  local_248.super_basic_buffer<char>.size_ = 0;
  local_248.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_001e5f08;
  local_248.super_basic_buffer<char>.capacity_ = 500;
  uVar2 = spec->precision_;
  uVar5 = *(undefined3 *)&spec->field_0x15;
  local_288._0_4_ = (spec->super_align_spec).width_;
  local_288._4_4_ = (spec->super_align_spec).fill_;
  local_288._8_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
  stack0xfffffffffffffd88 =
       (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
       CONCAT35(uVar5,CONCAT14(local_2c2.type,uVar2));
  local_248.super_basic_buffer<char>.ptr_ = local_248.store_;
  write_double_sprintf<long_double>
            (this,lVar12,(format_specs *)local_288,&local_248.super_basic_buffer<char>);
  size = local_248.super_basic_buffer<char>.size_;
  local_2b0.align_ = (spec->super_align_spec).align_;
  local_2b0.width_ = (spec->super_align_spec).width_;
  local_2b0.fill_ = (spec->super_align_spec).fill_;
  aVar1 = (spec->super_align_spec).align_;
  if (aVar1 == ALIGN_DEFAULT) {
    local_2b0.align_ = ALIGN_RIGHT;
  }
  else if (aVar1 == ALIGN_NUMERIC) {
    if (cVar11 != '\0') {
      pbVar4 = (this->out_).container;
      sVar9 = pbVar4->size_;
      uVar10 = sVar9 + 1;
      if (pbVar4->capacity_ < uVar10) {
        local_2c0 = (longdouble)CONCAT28(local_2c0._8_2_,uVar10);
        local_2a0 = sVar9;
        (**pbVar4->_vptr_basic_buffer)(pbVar4,uVar10);
        sVar9 = local_2a0;
        uVar10 = local_2c0._0_8_;
      }
      pbVar4->size_ = uVar10;
      pbVar4->ptr_[sVar9] = cVar11;
      if (local_2b0.width_ != 0) {
        local_2b0.width_ = local_2b0.width_ - 1;
      }
    }
    local_2b0.align_ = ALIGN_RIGHT;
    cVar11 = '\0';
    goto LAB_001987b7;
  }
  size = (local_248.super_basic_buffer<char>.size_ + 1) - (ulong)(cVar11 == '\0');
LAB_001987b7:
  local_288[8] = cVar11;
  unique0x00005300 = &local_248;
  local_288._0_8_ = size;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
  ::
  write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::double_writer>
            ((basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              *)this,size,&local_2b0,(double_writer *)local_288);
  local_248.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_001e5f08;
  if (local_248.super_basic_buffer<char>.ptr_ == local_248.store_) {
    return;
  }
  operator_delete(local_248.super_basic_buffer<char>.ptr_,
                  local_248.super_basic_buffer<char>.capacity_);
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler<char_type> handler(spec.type());
  internal::handle_float_type_spec(spec.type(), handler);

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::fputil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(INF_SIZE + (sign ? 1 : 0), spec,
                          inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  basic_memory_buffer<char_type> buffer;
  char type = static_cast<char>(spec.type());
  if (internal::const_check(
        internal::use_grisu() && sizeof(T) <= sizeof(double)) &&
      type != 'a' && type != 'A') {
    char buf[100]; // TODO: correct buffer size
    size_t size = 0;
    internal::grisu2_format(static_cast<double>(value), buf, size, type,
                            spec.precision(), spec.flag(HASH_FLAG));
    FMT_ASSERT(size <= 100, "buffer overflow");
    buffer.append(buf, buf + size); // TODO: avoid extra copy
  } else {
    format_specs normalized_spec(spec);
    normalized_spec.type_ = handler.type;
    write_double_sprintf(value, normalized_spec, buffer);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = sign;
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(n, as, double_writer{n, sign, buffer});
}